

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O2

float128 floatx80_to_float128(floatx80 a)

{
  uint uVar1;
  ulong uVar2;
  float128 fVar3;
  float128 fVar4;
  floatx80 a_00;
  commonNaNT local_20;
  
  uVar2 = a.low;
  a_00._0_8_ = a._0_8_ & 0xffffffff;
  uVar1 = a._0_4_ & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
      (short)uVar1 != 0x7fff) {
    fVar3.low = uVar2 << 0x31;
    fVar3.high = (ulong)uVar1 << 0x30 | (a._0_8_ >> 0xf) << 0x3f | uVar2 >> 0xf & 0xffffffffffff;
    return fVar3;
  }
  a_00.low = uVar2;
  floatx80ToCommonNaN(&local_20,a_00);
  fVar4.low = local_20.low >> 0x10 | local_20.high << 0x30;
  fVar4.high = (ulong)(uint)local_20._0_4_ << 0x3f | local_20.high >> 0x10 | 0x7fff800000000000;
  return fVar4;
}

Assistant:

float128 floatx80_to_float128( floatx80 a )
{
	flag aSign;
	int16 aExp;
	bits64 aSig, zSig0, zSig1;

	aSig = extractFloatx80Frac( a );
	aExp = extractFloatx80Exp( a );
	aSign = extractFloatx80Sign( a );
	if ( ( aExp == 0x7FFF ) && (bits64) ( aSig<<1 ) ) {
		return commonNaNToFloat128( floatx80ToCommonNaN( a ) );
	}
	shift128Right( aSig<<1, 0, 16, &zSig0, &zSig1 );
	return packFloat128( aSign, aExp, zSig0, zSig1 );

}